

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_basics.cpp
# Opt level: O2

bool Am_Check_One_Object_For_Inactive(Am_Object *object,Am_Slot_Key slot_for_inactive)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Value value;
  Am_Object cmd;
  
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(object,0x157,1);
  Am_Value::operator=(&value,pAVar2);
  bVar1 = Am_Value::Valid(&value);
  if (bVar1) {
    Am_Object::Am_Object(&cmd,&value);
    pAVar2 = Am_Object::Get(&cmd,slot_for_inactive,1);
    Am_Value::operator=(&value,pAVar2);
    bVar1 = Am_Value::Valid(&value);
    Am_Object::~Am_Object(&cmd);
    if (bVar1) {
      bVar1 = false;
      goto LAB_001b651d;
    }
  }
  bVar1 = true;
LAB_001b651d:
  Am_Value::~Am_Value(&value);
  return bVar1;
}

Assistant:

bool
Am_Check_One_Object_For_Inactive(Am_Object &object,
                                 Am_Slot_Key slot_for_inactive)
{
  Am_Value value;
  value = object.Peek(Am_INACTIVE_COMMANDS);
  if (value.Valid()) {
    Am_Object cmd = value;
    value = cmd.Peek(slot_for_inactive);
    if (value.Valid())
      return false;
  }
  return true; //if get here, all selected items are fine
}